

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_string.cc
# Opt level: O2

void SplitStringUsing(string *full,char *delim,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *result)

{
  char cVar1;
  char cVar2;
  char c;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  char c_1;
  size_type __n;
  char *pcVar7;
  char *pcVar8;
  allocator local_76;
  allocator local_75;
  Logger local_74;
  value_type local_70;
  string local_50;
  
  if (delim == (char *)0x0) {
    local_74.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/split_string.cc"
               ,&local_75);
    std::__cxx11::string::string((string *)&local_50,"SplitStringUsing",&local_76);
    poVar4 = Logger::Start(ERR,&local_70,0x34,&local_50);
    poVar4 = std::operator<<(poVar4,"CHECK failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/split_string.cc"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x34);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"delim != NULL");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::operator<<(poVar4,"\n");
  }
  else {
    if (result != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
      cVar1 = *delim;
      __n = 0;
      if ((cVar1 != '\0') && (delim[1] == '\0')) {
        pcVar6 = (full->_M_dataplus)._M_p;
        pcVar5 = pcVar6 + full->_M_string_length;
        pcVar8 = pcVar6;
        while( true ) {
          if (pcVar6 == pcVar5) break;
          pcVar7 = pcVar8 + 1;
          if (*pcVar6 == cVar1) {
            pcVar6 = pcVar6 + 1;
            pcVar8 = pcVar8 + 1;
          }
          else {
            do {
              pcVar6 = pcVar5;
              if (pcVar7 == pcVar5) break;
              cVar2 = *pcVar7;
              pcVar6 = pcVar7;
              pcVar7 = pcVar7 + 1;
            } while (cVar2 != cVar1);
            __n = (size_type)((int)__n + 1);
            pcVar8 = pcVar6;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(result,__n);
      cVar1 = *delim;
      if ((cVar1 == '\0') || (delim[1] != '\0')) {
        lVar3 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim);
        while (lVar3 != -1) {
          lVar3 = std::__cxx11::string::find_first_of((char *)full,(ulong)delim);
          if (lVar3 == -1) {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)full);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(result,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            return;
          }
          std::__cxx11::string::substr((ulong)&local_70,(ulong)full);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(result,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          lVar3 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim);
        }
      }
      else {
        pcVar6 = (full->_M_dataplus)._M_p;
        pcVar8 = pcVar6 + full->_M_string_length;
        while (pcVar6 != pcVar8) {
          pcVar5 = pcVar6;
          if (*pcVar6 == cVar1) {
            pcVar6 = pcVar6 + 1;
          }
          else {
            do {
              pcVar5 = pcVar5 + 1;
              pcVar7 = pcVar8;
              if (pcVar5 == pcVar8) break;
              pcVar7 = pcVar5;
            } while (*pcVar5 != cVar1);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar6,pcVar7);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(result,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            pcVar6 = pcVar7;
          }
        }
      }
      return;
    }
    local_74.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/split_string.cc"
               ,&local_75);
    std::__cxx11::string::string((string *)&local_50,"SplitStringUsing",&local_76);
    poVar4 = Logger::Start(ERR,&local_70,0x35,&local_50);
    poVar4 = std::operator<<(poVar4,"CHECK failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/split_string.cc"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x35);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"result != NULL");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_74);
  abort();
}

Assistant:

void SplitStringUsing(const std::string& full,
                      const char* delim,
                      std::vector<std::string>* result) {
  CHECK(delim != NULL);
  CHECK(result != NULL);
  result->reserve(CalculateReserveForVector(full, delim));
  back_insert_iterator< std::vector<std::string> > it(*result);
  SplitStringToIteratorUsing(full, delim, it);
}